

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_quantization_attribute_decoder.cc
# Opt level: O0

bool __thiscall
draco::SequentialQuantizationAttributeDecoder::DecodeDataNeededByPortableTransform
          (SequentialQuantizationAttributeDecoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,DecoderBuffer *in_buffer)

{
  uint16_t uVar1;
  uint uVar2;
  PointCloudDecoder *this_00;
  SequentialAttributeDecoder *in_RDI;
  PointAttribute *in_stack_00000008;
  AttributeTransform *in_stack_00000010;
  bool local_1;
  
  this_00 = SequentialAttributeDecoder::decoder(in_RDI);
  uVar1 = PointCloudDecoder::bitstream_version(this_00);
  if ((uVar1 < 0x200) ||
     (uVar2 = (*in_RDI->_vptr_SequentialAttributeDecoder[0xd])(), (uVar2 & 1) != 0)) {
    SequentialAttributeDecoder::portable_attribute((SequentialAttributeDecoder *)0x222b82);
    local_1 = AttributeTransform::TransferToAttribute(in_stack_00000010,in_stack_00000008);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SequentialQuantizationAttributeDecoder::
    DecodeDataNeededByPortableTransform(
        const std::vector<PointIndex> &point_ids, DecoderBuffer *in_buffer) {
  if (decoder()->bitstream_version() >= DRACO_BITSTREAM_VERSION(2, 0)) {
    // Decode quantization data here only for files with bitstream version 2.0+
    if (!DecodeQuantizedDataInfo()) {
      return false;
    }
  }

  // Store the decoded transform data in portable attribute;
  return quantization_transform_.TransferToAttribute(portable_attribute());
}